

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd.cc
# Opt level: O0

long fd_ctrl(BIO *b,int cmd,long num,void *ptr)

{
  int *out;
  void *ptr_local;
  long num_local;
  int cmd_local;
  BIO *b_local;
  
  if (cmd == 1) {
    ptr_local = (void *)0x0;
LAB_001e775b:
    if (b->init == 0) {
      b_local = (BIO *)0x0;
    }
    else {
      b_local = (BIO *)lseek(b->num,(__off_t)ptr_local,0);
    }
  }
  else {
    if (cmd != 3) {
      if (cmd == 8) {
        return (long)b->shutdown;
      }
      if (cmd == 9) {
        b->shutdown = (int)num;
        return 1;
      }
      if (cmd == 0xb) {
        return 1;
      }
      if (cmd == 0x68) {
        fd_free(b);
        b->num = *ptr;
        b->shutdown = (int)num;
        b->init = 1;
        return 1;
      }
      if (cmd == 0x69) {
        if (b->init != 0) {
          if (ptr != (void *)0x0) {
            *(int *)ptr = b->num;
          }
          return (long)b->num;
        }
        return -1;
      }
      ptr_local = (void *)num;
      if (cmd == 0x80) goto LAB_001e775b;
      if (cmd != 0x85) {
        return 0;
      }
    }
    if (b->init == 0) {
      b_local = (BIO *)0x0;
    }
    else {
      b_local = (BIO *)lseek(b->num,0,1);
    }
  }
  return (long)b_local;
}

Assistant:

static long fd_ctrl(BIO *b, int cmd, long num, void *ptr) {
  switch (cmd) {
    case BIO_CTRL_RESET:
      num = 0;
      [[fallthrough]];
    case BIO_C_FILE_SEEK:
      if (b->init) {
        return (long)BORINGSSL_LSEEK(b->num, num, SEEK_SET);
      }
      return 0;
    case BIO_C_FILE_TELL:
    case BIO_CTRL_INFO:
      if (b->init) {
        return (long)BORINGSSL_LSEEK(b->num, 0, SEEK_CUR);
      }
      return 0;
    case BIO_C_SET_FD:
      fd_free(b);
      b->num = *static_cast<int *>(ptr);
      b->shutdown = static_cast<int>(num);
      b->init = 1;
      return 1;
    case BIO_C_GET_FD:
      if (b->init) {
        int *out = static_cast<int *>(ptr);
        if (out != nullptr) {
          *out = b->num;
        }
        return b->num;
      } else {
        return -1;
      }
    case BIO_CTRL_GET_CLOSE:
      return b->shutdown;
    case BIO_CTRL_SET_CLOSE:
      b->shutdown = static_cast<int>(num);
      return 1;
    case BIO_CTRL_FLUSH:
      return 1;
    default:
      return 0;
  }
}